

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caxpy.c
# Opt level: O3

void caxpy_(integer *n,singlecomplex *ca,singlecomplex *cx,integer *incx,singlecomplex *cy,
           integer *incy)

{
  int iVar1;
  double dVar2;
  singlecomplex sVar3;
  singlecomplex sVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  singlecomplex *psVar9;
  singlecomplex *psVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  
  if (0 < *n) {
    fVar15 = ca->r;
    dVar2 = r_imag(ca);
    fVar14 = (float)dVar2;
    uVar12 = -(uint)(-fVar15 <= fVar15);
    uVar13 = -(uint)(-fVar14 <= fVar14);
    fVar15 = (float)(~uVar13 & (uint)-fVar14 | (uint)fVar14 & uVar13) +
             (float)(~uVar12 & (uint)-fVar15 | (uint)fVar15 & uVar12);
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      iVar1 = *incx;
      if ((long)iVar1 == 1) {
        iVar7 = *incy;
        uVar5 = (ulong)(uint)*n;
        lVar8 = 1;
        if (iVar7 == 1) {
          if (*n < 1) {
            return;
          }
          uVar6 = 0;
          do {
            fVar15 = cx[uVar6].r;
            fVar14 = cx[uVar6].i;
            sVar3.i = cy[uVar6].i + ca->r * fVar14 + fVar15 * ca->i;
            sVar3.r = cy[uVar6].r + ca->r * fVar15 + fVar14 * -ca->i;
            cy[uVar6] = sVar3;
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
          return;
        }
      }
      else {
        uVar5 = (ulong)(uint)*n;
        iVar7 = (1 - *n) * iVar1 + 1;
        if (-1 < iVar1) {
          iVar7 = 1;
        }
        lVar8 = (long)iVar7;
        iVar7 = *incy;
      }
      if (0 < (int)uVar5) {
        iVar11 = (1 - (int)uVar5) * iVar7 + 1;
        if (-1 < iVar7) {
          iVar11 = 1;
        }
        psVar9 = cx + lVar8 + -1;
        psVar10 = cy + (long)iVar11 + -1;
        do {
          fVar15 = (*psVar9).r;
          fVar14 = (*psVar9).i;
          sVar4.i = (*psVar10).i + ca->r * fVar14 + fVar15 * ca->i;
          sVar4.r = (*psVar10).r + ca->r * fVar15 + fVar14 * -ca->i;
          *psVar10 = sVar4;
          psVar9 = psVar9 + iVar1;
          psVar10 = psVar10 + iVar7;
          uVar12 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar12;
        } while (uVar12 != 0);
      }
    }
  }
  return;
}

Assistant:

void caxpy_(integer *n, singlecomplex *ca, singlecomplex *cx, integer *
	incx, singlecomplex *cy, integer *incy)
{


    /* System generated locals */

    real r__1, r__2;
    singlecomplex q__1, q__2;

    /* Builtin functions */
    double r_imag(singlecomplex *);

    /* Local variables */
    integer i, ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if ((r__1 = ca->r, dabs(r__1)) + (r__2 = r_imag(ca), dabs(r__2)) == 0.f) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(ix).r - ca->i * CX(ix).i, q__2.i = ca->r * CX(
		ix).i + ca->i * CX(ix).r;
	q__1.r = CY(iy).r + q__2.r, q__1.i = CY(iy).i + q__2.i;
	CY(iy).r = q__1.r, CY(iy).i = q__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(i).r - ca->i * CX(i).i, q__2.i = ca->r * CX(
		i).i + ca->i * CX(i).r;
	q__1.r = CY(i).r + q__2.r, q__1.i = CY(i).i + q__2.i;
	CY(i).r = q__1.r, CY(i).i = q__1.i;
/* L30: */
    }
    return;
}